

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::get_mutable_callback(session_impl *this,item *i,bool authoritative)

{
  array<char,_32UL> *args;
  array<char,_64UL> *args_1;
  string *args_3;
  entry *args_4;
  int64_t local_28;
  bool local_19;
  item *piStack_18;
  bool authoritative_local;
  item *i_local;
  session_impl *this_local;
  
  local_19 = authoritative;
  piStack_18 = i;
  i_local = (item *)this;
  args = &libtorrent::dht::item::pk(i)->bytes;
  args_1 = &libtorrent::dht::item::sig(piStack_18)->bytes;
  local_28 = (int64_t)libtorrent::dht::item::seq(piStack_18);
  args_3 = libtorrent::dht::item::salt_abi_cxx11_(piStack_18);
  args_4 = libtorrent::dht::item::value(piStack_18);
  alert_manager::
  emplace_alert<libtorrent::dht_mutable_item_alert,std::array<char,32ul>const&,std::array<char,64ul>const&,long,std::__cxx11::string_const&,libtorrent::entry_const&,bool_const&>
            (&this->m_alerts,args,args_1,&local_28,args_3,args_4,&local_19);
  return;
}

Assistant:

void session_impl::get_mutable_callback(dht::item const& i
		, bool const authoritative)
	{
		TORRENT_ASSERT(i.is_mutable());
		m_alerts.emplace_alert<dht_mutable_item_alert>(i.pk().bytes
			, i.sig().bytes, i.seq().value
			, i.salt(), i.value(), authoritative);
	}